

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O0

value_ptr __thiscall pstore::dump::make_value(dump *this,header *header)

{
  initializer_list<pstore::dump::object::member> __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar1;
  member *local_3a8;
  allocator<pstore::dump::object::member> local_30a;
  undefined1 local_309;
  address local_308;
  value_ptr local_300;
  allocator local_2e9;
  string local_2e8;
  value_ptr local_2c8;
  allocator local_2b1;
  string local_2b0;
  container_type local_290;
  value_ptr local_280;
  allocator local_269;
  string local_268;
  const_iterator local_248;
  const_iterator local_240;
  value_ptr local_238;
  allocator local_221;
  string local_220;
  value_ptr local_200;
  allocator local_1e9;
  string local_1e8;
  const_iterator local_1c8;
  const_iterator local_1c0;
  value_ptr local_1b8 [2];
  allocator local_191;
  string local_190;
  member *local_170;
  member local_168;
  member local_138;
  member local_108;
  member local_d8;
  member local_a8;
  member local_78;
  iterator local_48;
  size_type local_40;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  array<unsigned_short,_2UL> *version;
  header *header_local;
  
  version = (array<unsigned_short,_2UL> *)header;
  header_local = (header *)this;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pstore::header::version(header);
  local_309 = 1;
  local_170 = &local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"signature1",&local_191);
  local_1c0 = std::begin<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)version);
  local_1c8 = std::end<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)version);
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)local_1b8,&local_1c0,&local_1c8,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(&local_168,&local_190,local_1b8);
  local_170 = &local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"signature2",&local_1e9);
  make_value((dump *)&local_200,(uint32_t *)(version + 1));
  object::member::member(&local_138,&local_1e8,&local_200);
  local_170 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"version",&local_221);
  local_240 = std::begin<std::array<unsigned_short,2ul>>
                        ((array<unsigned_short,_2UL> *)local_20._M_pi);
  local_248 = std::end<std::array<unsigned_short,2ul>>((array<unsigned_short,_2UL> *)local_20._M_pi)
  ;
  make_value<unsigned_short_const*,unsigned_short,std::shared_ptr<pstore::dump::value>(*)(unsigned_short_const&)>
            ((dump *)&local_238,&local_240,&local_248,
             details::default_make_value<unsigned_short_const&>);
  object::member::member(&local_108,&local_220,&local_238);
  local_170 = &local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"id",&local_269);
  local_290._M_elems = (_Type)pstore::header::id((header *)version);
  make_value((dump *)&local_280,(uuid *)&local_290);
  object::member::member(&local_d8,&local_268,&local_280);
  local_170 = &local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"crc",&local_2b1);
  make_value((dump *)&local_2c8,(uint32_t *)(version + 8));
  object::member::member(&local_a8,&local_2b0,&local_2c8);
  local_170 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"footer_pos",&local_2e9);
  local_308.a_ = (value_type)
                 std::atomic<pstore::typed_address<pstore::trailer>_>::load
                           ((atomic<pstore::typed_address<pstore::trailer>_> *)(version + 10),
                            memory_order_seq_cst);
  make_value<pstore::trailer>((dump *)&local_300,(typed_address<pstore::trailer>)local_308.a_);
  object::member::member(&local_78,&local_2e8,&local_300);
  local_309 = 0;
  local_48 = &local_168;
  local_40 = 6;
  std::allocator<pstore::dump::object::member>::allocator(&local_30a);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_38,__l,&local_30a);
  make_value(this,&local_38);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_38);
  std::allocator<pstore::dump::object::member>::~allocator(&local_30a);
  local_3a8 = (member *)&local_48;
  do {
    local_3a8 = local_3a8 + -1;
    object::member::~member(local_3a8);
  } while (local_3a8 != &local_168);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_300);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_2c8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_280);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_238);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_200);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(local_1b8);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (header const & header) {
            auto const & version = header.version ();
            return make_value (object::container{
                {"signature1",
                 make_value (std::begin (header.a.signature1), std::end (header.a.signature1))},
                {"signature2", make_value (header.a.signature2)},
                {"version", make_value (std::begin (version), std::end (version))},
                {"id", make_value (header.id ())},
                {"crc", make_value (header.crc)},
                {"footer_pos", make_value (header.footer_pos.load ())},
            });
        }